

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O1

pair<llvm::NoneType,_bool> __thiscall
llvm::SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_>::insert
          (SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *this,DWARFDie *V)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  int *piVar4;
  long lVar5;
  uint uVar6;
  pair<llvm::NoneType,_bool> pVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  pair<std::_Rb_tree_iterator<llvm::DWARFDie>,_bool> pVar11;
  SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *pSVar7;
  
  if ((this->Set)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    piVar4 = (int *)(this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
                    super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
                    super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.
                    BeginX;
    uVar2 = (this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
            super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
            super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size;
    uVar3 = (ulong)uVar2;
    lVar5 = uVar3 * 0x10;
    piVar1 = piVar4 + uVar3 * 4;
    if (uVar3 != 0) {
      pSVar7 = this;
      do {
        auVar9._0_4_ = -(uint)(*piVar4 == *(int *)&V->U);
        auVar9._4_4_ = -(uint)(piVar4[1] == *(int *)((long)&V->U + 4));
        auVar9._8_4_ = -(uint)(piVar4[2] == *(int *)&V->Die);
        auVar9._12_4_ = -(uint)(piVar4[3] == *(int *)((long)&V->Die + 4));
        auVar10._4_4_ = auVar9._0_4_;
        auVar10._0_4_ = auVar9._4_4_;
        auVar10._8_4_ = auVar9._12_4_;
        auVar10._12_4_ = auVar9._8_4_;
        uVar6 = movmskpd((int)pSVar7,auVar10 & auVar9);
        pSVar7 = (SmallSet<llvm::DWARFDie,_3U,_std::less<llvm::DWARFDie>_> *)(ulong)uVar6;
        if (uVar6 == 3) break;
        piVar4 = piVar4 + 4;
        lVar5 = lVar5 + -0x10;
      } while (lVar5 != 0);
    }
    pVar8.first = None;
    pVar8.second = false;
    pVar8._5_3_ = 0;
    if (piVar4 == piVar1) {
      if (uVar2 < 3) {
        pVar8.first = None;
        pVar8.second = true;
        pVar8._5_3_ = 0;
        SmallVectorTemplateBase<llvm::DWARFDie,_true>::push_back
                  ((SmallVectorTemplateBase<llvm::DWARFDie,_true> *)this,V);
      }
      else {
        uVar2 = (this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
                super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
                super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size;
        uVar3 = (ulong)uVar2;
        if (uVar2 != 0) {
          do {
            std::
            _Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
            ::_M_insert_unique<llvm::DWARFDie_const&>
                      ((_Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
                        *)&this->Set,
                       (DWARFDie *)
                       ((long)(this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
                              super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
                              super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.
                              super_SmallVectorBase.BeginX + (uVar3 & 0xffffffff) * 0x10 + -0x10));
            uVar3 = (ulong)(this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
                           super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
                           super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.
                           super_SmallVectorBase.Size - 1;
            if ((this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
                super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
                super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Capacity
                < uVar3) {
              __assert_fail("N <= capacity()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                            ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
            }
            (this->Vector).super_SmallVectorImpl<llvm::DWARFDie>.
            super_SmallVectorTemplateBase<llvm::DWARFDie,_true>.
            super_SmallVectorTemplateCommon<llvm::DWARFDie,_void>.super_SmallVectorBase.Size =
                 (uint)uVar3;
          } while ((uint)uVar3 != 0);
        }
        pVar8.first = None;
        pVar8.second = true;
        pVar8._5_3_ = 0;
        std::
        _Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
        ::_M_insert_unique<llvm::DWARFDie_const&>
                  ((_Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
                    *)&this->Set,V);
      }
    }
  }
  else {
    pVar11 = std::
             _Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
             ::_M_insert_unique<llvm::DWARFDie_const&>
                       ((_Rb_tree<llvm::DWARFDie,llvm::DWARFDie,std::_Identity<llvm::DWARFDie>,std::less<llvm::DWARFDie>,std::allocator<llvm::DWARFDie>>
                         *)&this->Set,V);
    pVar8 = (pair<llvm::NoneType,_bool>)(((ulong)pVar11.second << 0x20) + 1);
  }
  return pVar8;
}

Assistant:

std::pair<NoneType, bool> insert(const T &V) {
    if (!isSmall())
      return std::make_pair(None, Set.insert(V).second);

    VIterator I = vfind(V);
    if (I != Vector.end())    // Don't reinsert if it already exists.
      return std::make_pair(None, false);
    if (Vector.size() < N) {
      Vector.push_back(V);
      return std::make_pair(None, true);
    }

    // Otherwise, grow from vector to set.
    while (!Vector.empty()) {
      Set.insert(Vector.back());
      Vector.pop_back();
    }
    Set.insert(V);
    return std::make_pair(None, true);
  }